

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ReduceRightObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *callBackFn,Var accumulator,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  RecyclableObject *pRVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  JavascriptMethod p_Var7;
  uint64 uVar8;
  uint64 uVar9;
  long lVar10;
  undefined1 auVar11 [8];
  ulong uVar12;
  double value;
  undefined1 auVar13 [16];
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  Var local_50;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,obj);
  auVar11 = local_80;
  lVar10 = length - start;
  local_50 = accumulator;
  if (start <= length && lVar10 != 0) {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
    do {
      uVar12 = lVar10 - 1;
      ((ThreadContext *)auVar11)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
      BVar5 = JavascriptOperators::HasItem(obj,uVar12);
      JsReentLock::MutateArrayObject((JsReentLock *)local_80);
      *(bool *)((long)local_80 + 0x108) = true;
      if (BVar5 != 0) {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar6 = JavascriptOperators::GetItem(obj,uVar12,scriptContext);
        this = scriptContext->threadContext;
        bVar1 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var7);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        pRVar2 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        if (uVar12 < 0x80000000) {
          uVar12 = lVar10 + 0xffffffffffff;
        }
        else {
          auVar13._8_4_ = (int)(uVar12 >> 0x20);
          auVar13._0_8_ = uVar12;
          auVar13._12_4_ = 0x45300000;
          value = ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0) +
                  (auVar13._8_8_ - 1.9342813113834067e+25);
          uVar8 = NumberUtilities::ToSpecial(value);
          bVar4 = NumberUtilities::IsNan(value);
          if (bVar4) {
            uVar9 = NumberUtilities::ToSpecial(value);
            if (uVar9 != 0xfff8000000000000) {
              uVar9 = NumberUtilities::ToSpecial(value);
              if (uVar9 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)jsReentLock._24_8_ = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar4) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                *(undefined4 *)jsReentLock._24_8_ = 0;
              }
            }
          }
          uVar12 = uVar8 ^ 0xfffc000000000000;
        }
        local_50 = (*p_Var7)(callBackFn,(CallInfo)callBackFn,0x2000005,0,0,0,0,0x2000005,pRVar2,
                             local_50,pvVar6,uVar12,obj);
        this->reentrancySafeOrHandled = bVar1;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
      }
      lVar10 = lVar10 + -1;
      auVar11 = local_80;
    } while (lVar10 != 0);
  }
  ((ThreadContext *)local_80)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return local_50;
}

Assistant:

Var JavascriptArray::ReduceRightObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var accumulator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        T index = 0;

        for (T k = start; k < length; k++)
        {
            index = length - k - 1;
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, index, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                callBackFn, CallInfo(CallFlags_Value, 5), scriptContext->GetLibrary()->GetUndefined(),
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }

        return accumulator;
    }